

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O1

Variable *
soul::BlockBuilder::createVariable<soul::Identifier>
          (Module *m,Type *type,Identifier *name,Role role)

{
  string *psVar1;
  Variable *pVVar2;
  string_view newString;
  Role local_2c;
  CodeLocation local_28;
  Identifier local_18;
  
  local_28.sourceCode.object = (SourceCodeText *)0x0;
  local_28.location.data = (char *)0x0;
  psVar1 = name->name;
  local_2c = role;
  if (psVar1 == (string *)0x0) {
    local_18.name = (string *)0x0;
  }
  else {
    newString._M_str = (psVar1->_M_dataplus)._M_p;
    newString._M_len = psVar1->_M_string_length;
    local_18 = Identifier::Pool::get(&m->allocator->identifiers,newString);
  }
  pVVar2 = PoolAllocator::
           allocate<soul::heart::Variable,soul::CodeLocation,soul::Type,soul::Identifier,soul::heart::Variable::Role&>
                     (&m->allocator->pool,&local_28,type,&local_18,&local_2c);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.sourceCode.object);
  return pVVar2;
}

Assistant:

static heart::Variable& createVariable (Module& m, Type type, StringType&& name, heart::Variable::Role role)
    {
        return m.allocate<heart::Variable> (CodeLocation(), std::move (type), m.allocator.get (name), role);
    }